

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_skip_bytes_in_case_type_is_unknown_Test
::TestBody(PriceUpdateDecoderTest_test_skip_bytes_in_case_type_is_unknown_Test *this)

{
  undefined1 *puVar1;
  bool bVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ByteBuffer *pBVar5;
  char *pcVar6;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  double price;
  PriceField price_field_price;
  PriceField price_field_string;
  string string;
  PriceField price_field_unknown;
  FieldDef field_def_price;
  FieldDef field_def_unknown;
  FieldDef field_def_string;
  AssertHelper local_1c8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  double local_190;
  ByteBuffer local_188 [16];
  ByteBuffer local_178 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  ByteBuffer local_148 [16];
  long *local_138 [2];
  long local_128 [2];
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  FieldDef local_b8 [8];
  long *local_b0;
  long local_a0 [3];
  FieldDef local_88 [8];
  long *local_80;
  long local_70 [3];
  FieldDef local_58 [8];
  long *local_50;
  long local_40 [3];
  
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"ciao","");
  puVar3 = (undefined8 *)operator_new__(9);
  *puVar3 = 0x807060504030201;
  *(undefined1 *)(puVar3 + 1) = 9;
  local_190 = 9876.543;
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,local_168._M_dataplus._M_p,
             local_168._M_dataplus._M_p + local_168._M_string_length);
  puVar1 = &(this->super_PriceUpdateDecoderTest).field_0x18;
  bidfx_public_api::tools::Varint::WriteString(puVar1,local_d8);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  bidfx_public_api::tools::Varint::WriteU32((OutputStream *)puVar1,9);
  pBVar5 = &(this->super_PriceUpdateDecoderTest).buffer;
  bidfx_public_api::tools::ByteBuffer::WriteBytes((uchar *)pBVar5,(ulong)puVar3);
  uVar4 = (ulong)(local_190 * 1000000.0);
  bidfx_public_api::tools::Varint::WriteU64
            ((OutputStream *)puVar1,
             (long)(local_190 * 1000000.0 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"field","");
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_58,1,0x53,local_f8);
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"field","");
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_88,1,0x20,local_118,0x42,0);
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"field","");
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_b8,1,0x44,local_138,0x56,6);
  if (local_138[0] != local_128) {
    operator_delete(local_138[0],local_128[0] + 1);
  }
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField(local_178,(FieldDef *)pBVar5);
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField(local_148,(FieldDef *)pBVar5);
  bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeField(local_188,(FieldDef *)pBVar5);
  local_1c0.ptr_._0_4_ = 3;
  local_1c8.data_._0_4_ = bidfx_public_api::price::PriceField::GetType();
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((internal *)&local_1b0,"PriceField::STRING","price_field_string.GetType()",
             (Type *)&local_1c0,(Type *)&local_1c8);
  if ((char)local_1b0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1c0);
    if ((undefined8 *)local_1b0._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_1b0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x58,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (local_1c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_1c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1c0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1b0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::PriceField::GetString_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_1c0,"string","price_field_string.GetString()",&local_168,&local_1b0)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1b0._M_dataplus._M_p._1_7_,(char)local_1b0._M_dataplus._M_p) !=
      &local_1b0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1b0._M_dataplus._M_p._1_7_,(char)local_1b0._M_dataplus._M_p),
                    local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_1c0.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b0);
    if (local_1b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_1b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x59,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (CONCAT71(local_1b0._M_dataplus._M_p._1_7_,(char)local_1b0._M_dataplus._M_p) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_1b0._M_dataplus._M_p._1_7_,(char)local_1b0._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_1b0._M_dataplus._M_p._1_7_,
                                       (char)local_1b0._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1c0.ptr_._0_4_ = 4;
  local_1c8.data_._0_4_ = bidfx_public_api::price::PriceField::GetType();
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((internal *)&local_1b0,"PriceField::NOTHING","price_field_unknown.GetType()",
             (Type *)&local_1c0,(Type *)&local_1c8);
  if ((char)local_1b0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1c0);
    if ((undefined8 *)local_1b0._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_1b0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x5a,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (local_1c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_1c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1c0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1b0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1c0.ptr_._0_4_ = 2;
  local_1c8.data_._0_4_ = bidfx_public_api::price::PriceField::GetType();
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::PriceField::Type,bidfx_public_api::price::PriceField::Type>
            ((internal *)&local_1b0,"PriceField::DOUBLE","price_field_price.GetType()",
             (Type *)&local_1c0,(Type *)&local_1c8);
  if ((char)local_1b0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1c0);
    if ((undefined8 *)local_1b0._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_1b0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x5b,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (local_1c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_1c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1c0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1b0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1c0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       bidfx_public_api::price::PriceField::GetDouble();
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_1b0,"price","price_field_price.GetDouble()",&local_190,
             (double *)&local_1c0);
  if ((char)local_1b0._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_1c0);
    if ((undefined8 *)local_1b0._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_1b0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_update_decoder_test.cpp"
               ,0x5c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if (local_1c0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_1c0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1c0.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1b0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)local_188);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)local_148);
  bidfx_public_api::price::PriceField::~PriceField((PriceField *)local_178);
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_skip_bytes_in_case_type_is_unknown)
{
    std::string string = "ciao";
    unsigned char* unknown = new unsigned char[9]{1, 2, 3, 4, 5, 6, 7, 8, 9};
    double price = 9876.543;

    // STRING
    Varint::WriteString(buffer, string);
    // UNDECODABLE
    Varint::WriteU32(buffer, 9);
    buffer.WriteBytes(unknown, 9);
    // PRICE
    Varint::WriteU64(buffer, (uint64_t)(price * 1000000));

    FieldDef field_def_string = FieldDef(1, FieldTypeEnum::STRING, "field");
    FieldDef field_def_unknown = FieldDef(1, FieldTypeEnum::UNRECOGNISED, "field", FieldEncodingEnum::BYTE_ARRAY, 0);
    FieldDef field_def_price = FieldDef(1, FieldTypeEnum::DOUBLE, "field", FieldEncodingEnum::VARINT, 6);
    PriceField price_field_string = PriceUpdateDecoder::DecodeField(buffer, field_def_string);
    PriceField price_field_unknown = PriceUpdateDecoder::DecodeField(buffer, field_def_unknown);
    PriceField price_field_price = PriceUpdateDecoder::DecodeField(buffer, field_def_price);

    EXPECT_EQ(PriceField::STRING, price_field_string.GetType());
    EXPECT_EQ(string, price_field_string.GetString());
    EXPECT_EQ(PriceField::NOTHING, price_field_unknown.GetType());
    EXPECT_EQ(PriceField::DOUBLE, price_field_price.GetType());
    EXPECT_EQ(price, price_field_price.GetDouble());
}